

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

void __thiscall QBitArray::resize(QBitArray *this,qsizetype size)

{
  char *data;
  
  if (0 < size) {
    QByteArray::resize(&this->d,(size + 7U >> 3) + 1,'\0');
    data = QByteArray::data(&this->d);
    adjust_head_and_tail(data,(this->d).d.size,size);
    return;
  }
  QByteArray::resize(&this->d,0);
  return;
}

Assistant:

void QBitArray::resize(qsizetype size)
{
    Q_ASSERT_X(size >= 0, "QBitArray::resize", "Size must be greater than or equal to 0.");
    if (size <= 0) {
        d.resize(0);
    } else {
        d.resize(allocation_size(size), 0x00);
        adjust_head_and_tail(d.data(), d.size(), size);
    }
}